

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O2

bool __thiscall
ON_Polyline::CreateCircumscribedPolygon(ON_Polyline *this,ON_Circle *circle,int side_count)

{
  double *pdVar1;
  double dVar2;
  ON_3dPoint *pOVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  ON_Circle *pOVar7;
  ON_Circle *pOVar8;
  int iVar9;
  byte bVar10;
  ON_3dPoint local_d0;
  ON_Circle local_b8;
  
  bVar10 = 0;
  bVar4 = ON_Circle::IsValid(circle);
  if (2 < side_count && bVar4) {
    ON_SimpleArray<ON_3dPoint>::SetCapacity
              ((ON_SimpleArray<ON_3dPoint> *)this,(ulong)(side_count + 1U));
    if (side_count < (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = side_count + 1U;
    }
    pOVar7 = circle;
    pOVar8 = &local_b8;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pOVar8->plane).origin.x = (pOVar7->plane).origin.x;
      pOVar7 = (ON_Circle *)((long)pOVar7 + (ulong)bVar10 * -0x10 + 8);
      pOVar8 = (ON_Circle *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    dVar2 = circle->radius;
    local_b8.radius = cos(3.141592653589793 / (double)side_count);
    local_b8.radius = dVar2 / local_b8.radius;
    uVar5 = (ulong)(uint)side_count;
    iVar9 = 1;
    for (lVar6 = 0; uVar5 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
      ON_Circle::PointAt(&local_d0,&local_b8,
                         (double)iVar9 * (3.141592653589793 / (double)side_count));
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      *(double *)((long)&pOVar3->z + lVar6) = local_d0.z;
      pdVar1 = (double *)((long)&pOVar3->x + lVar6);
      *pdVar1 = local_d0.x;
      pdVar1[1] = local_d0.y;
      iVar9 = iVar9 + 2;
    }
    pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar3[uVar5].z = pOVar3->z;
    dVar2 = pOVar3->y;
    pOVar3[uVar5].x = pOVar3->x;
    pOVar3[uVar5].y = dVar2;
    ON_Plane::~ON_Plane(&local_b8.plane);
  }
  else {
    ON_SimpleArray<ON_3dPoint>::Destroy((ON_SimpleArray<ON_3dPoint> *)this);
  }
  return 2 < side_count && bVar4;
}

Assistant:

bool ON_Polyline::CreateCircumscribedPolygon(
            const ON_Circle& circle,
            int side_count
            )
{
  bool rc = ( circle.IsValid() && side_count >= 3 ) ? true : false;
  if ( rc )
  {
    SetCapacity(side_count+1);
    SetCount(side_count+1);
    double half_a = ON_PI/side_count;
    int i;
    ON_Circle c = circle;
    c.radius = circle.radius/cos(half_a);
    for ( i = 0; i < side_count; i++ )
    {
      m_a[i] = c.PointAt(half_a*(1+2*i));
    }
    m_a[side_count] = m_a[0];
  }
  else
    Destroy();
  return rc;
}